

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall mjs::parser::parse_unary_expression(parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  wostream *pwVar4;
  socklen_t *in_RCX;
  wchar_t *extraout_RDX;
  wstring_view *s;
  wstring_view *s_00;
  pointer *__ptr;
  token_type *in_RSI;
  wchar_t *in_R9;
  wstring_view name;
  wstring_view message;
  wstring_view message_00;
  expression_ptr e;
  token_type t;
  wostringstream _oss;
  undefined1 local_1f8 [16];
  source_extend *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_1e0;
  undefined1 local_1cc [12];
  undefined1 local_1c0 [384];
  
  local_1cc._0_4_ = in_RSI[0x20];
  if ((((local_1cc._0_4_ - plusplus < 0x31) &&
       (in_RCX = (socklen_t *)0x1000000630003,
       (0x1000000630003U >> ((ulong)(local_1cc._0_4_ - plusplus) & 0x3f) & 1) != 0)) ||
      (local_1cc._0_4_ == void_)) || (local_1cc._0_4_ == typeof_)) {
    accept((parser *)&stack0xffffffffffffffc0,(int)in_RSI,(sockaddr *)(ulong)(uint)local_1cc._0_4_,
           in_RCX);
    token::destroy((token *)&stack0xffffffffffffffc0);
    parse_unary_expression((parser *)local_1f8);
    if ((char)in_RSI[0x18] == line_terminator) {
      if (local_1cc._0_4_ == delete_) {
        iVar3 = (**(code **)(*(long *)local_1f8._0_8_ + 0x18))();
        if (iVar3 == 0) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)(local_1c0 + 8));
          pwVar4 = std::operator<<((wostream *)(local_1c0 + 8),
                                   "May not delete unqualified identifier \"");
          local_1c0._0_8_ = *(undefined8 *)((long)&((wstring *)(local_1f8._0_8_ + 8))->field_2 + 8);
          local_1cc._4_8_ = (((wstring *)(local_1f8._0_8_ + 0x28))->_M_dataplus)._M_p;
          cpp_quote_abi_cxx11_((wstring *)(local_1f8 + 8),(mjs *)(local_1cc + 4),s);
          pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar4,(wchar_t *)local_1f8._8_8_,(long)local_1e8);
          std::operator<<(pwVar4,"\" in strict mode");
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1f8._8_8_ != &local_1e0) {
            operator_delete((void *)local_1f8._8_8_,local_1e0._M_allocated_capacity * 4 + 4);
          }
          std::__cxx11::wstringbuf::str();
          message._M_str = in_R9;
          message._M_len = local_1f8._8_8_;
          syntax_error((parser *)"parse_unary_expression",(char *)0x240,local_1f8._0_4_ + 8,
                       local_1e8,message);
        }
      }
      uVar1 = local_1f8._0_8_;
      iVar3 = (**(code **)(*(long *)local_1f8._0_8_ + 0x18))(local_1f8._0_8_);
      if (iVar3 == 0) {
        name._M_str = extraout_RDX;
        name._M_len = *(size_t *)((long)&((wstring *)(uVar1 + 8))->field_2 + 8);
        bVar2 = is_strict_mode_unassignable_identifier
                          ((mjs *)(((wstring *)(uVar1 + 0x28))->_M_dataplus)._M_p,name);
        if (bVar2) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)(local_1c0 + 8));
          pwVar4 = std::operator<<((wostream *)(local_1c0 + 8),"\"");
          local_1c0._0_8_ = *(undefined8 *)((long)&((wstring *)(local_1f8._0_8_ + 8))->field_2 + 8);
          local_1cc._4_8_ = (((wstring *)(local_1f8._0_8_ + 0x28))->_M_dataplus)._M_p;
          cpp_quote_abi_cxx11_((wstring *)(local_1f8 + 8),(mjs *)(local_1cc + 4),s_00);
          pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar4,(wchar_t *)local_1f8._8_8_,(long)local_1e8);
          std::operator<<(pwVar4,"\" may not be modified in strict mode");
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1f8._8_8_ != &local_1e0) {
            operator_delete((void *)local_1f8._8_8_,local_1e0._M_allocated_capacity * 4 + 4);
          }
          std::__cxx11::wstringbuf::str();
          message_00._M_str = in_R9;
          message_00._M_len = local_1f8._8_8_;
          syntax_error((parser *)"parse_unary_expression",(char *)0x243,local_1f8._0_4_ + 8,
                       local_1e8,message_00);
        }
      }
    }
    make_expression<mjs::prefix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              (this,in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1cc);
    if ((element_type *)local_1f8._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_1f8._0_8_ + 8))();
    }
  }
  else {
    parse_postfix_expression(this);
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_unary_expression() {
        switch (auto t = current_token_type(); t) {
        case token_type::delete_:
        case token_type::void_:
        case token_type::typeof_:
        case token_type::plusplus:
        case token_type::minusminus:
        case token_type::plus:
        case token_type::minus:
        case token_type::tilde:
        case token_type::not_:
            {
                accept(t);
                auto e = parse_unary_expression();
                if (strict_mode_) {
                    if (t == token_type::delete_ && e->type() == expression_type::identifier) {
                        SYNTAX_ERROR_AT("May not delete unqualified identifier \"" << cpp_quote(static_cast<const identifier_expression&>(*e).id()) << "\" in strict mode", e->extend());
                    }
                    if (is_strict_mode_unassignable_identifier(*e)) {
                        SYNTAX_ERROR_AT("\"" << cpp_quote(static_cast<const identifier_expression&>(*e).id()) << "\" may not be modified in strict mode", e->extend());
                    }
                }
                return make_expression<prefix_expression>(t, std::move(e));
            }
        default:
            return parse_postfix_expression();
        }
    }